

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TasmanianSparseGrid.cpp
# Opt level: O2

void __thiscall TasGrid::TasmanianSparseGrid::writeBinary(TasmanianSparseGrid *this,ostream *ofs)

{
  BaseCanonicalGrid *pBVar1;
  int iVar2;
  char vals;
  
  ::std::ostream::write((char *)ofs,0x1cd29c);
  pBVar1 = (this->base)._M_t.
           super___uniq_ptr_impl<TasGrid::BaseCanonicalGrid,_std::default_delete<TasGrid::BaseCanonicalGrid>_>
           ._M_t.
           super__Tuple_impl<0UL,_TasGrid::BaseCanonicalGrid_*,_std::default_delete<TasGrid::BaseCanonicalGrid>_>
           .super__Head_base<0UL,_TasGrid::BaseCanonicalGrid_*,_false>._M_head_impl;
  if (pBVar1 != (BaseCanonicalGrid *)0x0) {
    iVar2 = (*pBVar1->_vptr_BaseCanonicalGrid[2])();
    vals = 'g';
    if ((char)iVar2 != '\0') goto LAB_00161b1a;
    pBVar1 = (this->base)._M_t.
             super___uniq_ptr_impl<TasGrid::BaseCanonicalGrid,_std::default_delete<TasGrid::BaseCanonicalGrid>_>
             ._M_t.
             super__Tuple_impl<0UL,_TasGrid::BaseCanonicalGrid_*,_std::default_delete<TasGrid::BaseCanonicalGrid>_>
             .super__Head_base<0UL,_TasGrid::BaseCanonicalGrid_*,_false>._M_head_impl;
    if (pBVar1 != (BaseCanonicalGrid *)0x0) {
      iVar2 = (*pBVar1->_vptr_BaseCanonicalGrid[3])();
      vals = 's';
      if ((char)iVar2 != '\0') goto LAB_00161b1a;
      pBVar1 = (this->base)._M_t.
               super___uniq_ptr_impl<TasGrid::BaseCanonicalGrid,_std::default_delete<TasGrid::BaseCanonicalGrid>_>
               ._M_t.
               super__Tuple_impl<0UL,_TasGrid::BaseCanonicalGrid_*,_std::default_delete<TasGrid::BaseCanonicalGrid>_>
               .super__Head_base<0UL,_TasGrid::BaseCanonicalGrid_*,_false>._M_head_impl;
      if (pBVar1 != (BaseCanonicalGrid *)0x0) {
        iVar2 = (*pBVar1->_vptr_BaseCanonicalGrid[4])();
        vals = 'p';
        if ((char)iVar2 != '\0') goto LAB_00161b1a;
        pBVar1 = (this->base)._M_t.
                 super___uniq_ptr_impl<TasGrid::BaseCanonicalGrid,_std::default_delete<TasGrid::BaseCanonicalGrid>_>
                 ._M_t.
                 super__Tuple_impl<0UL,_TasGrid::BaseCanonicalGrid_*,_std::default_delete<TasGrid::BaseCanonicalGrid>_>
                 .super__Head_base<0UL,_TasGrid::BaseCanonicalGrid_*,_false>._M_head_impl;
        if (pBVar1 != (BaseCanonicalGrid *)0x0) {
          iVar2 = (*pBVar1->_vptr_BaseCanonicalGrid[5])();
          vals = 'w';
          if ((char)iVar2 != '\0') goto LAB_00161b1a;
          pBVar1 = (this->base)._M_t.
                   super___uniq_ptr_impl<TasGrid::BaseCanonicalGrid,_std::default_delete<TasGrid::BaseCanonicalGrid>_>
                   ._M_t.
                   super__Tuple_impl<0UL,_TasGrid::BaseCanonicalGrid_*,_std::default_delete<TasGrid::BaseCanonicalGrid>_>
                   .super__Head_base<0UL,_TasGrid::BaseCanonicalGrid_*,_false>._M_head_impl;
          if (pBVar1 != (BaseCanonicalGrid *)0x0) {
            iVar2 = (*pBVar1->_vptr_BaseCanonicalGrid[6])();
            vals = 'f';
            if ((char)iVar2 != '\0') goto LAB_00161b1a;
          }
        }
      }
    }
  }
  vals = 'e';
LAB_00161b1a:
  IO::writeNumbers<true,(TasGrid::IO::IOPad)0,char>(ofs,vals);
  pBVar1 = (this->base)._M_t.
           super___uniq_ptr_impl<TasGrid::BaseCanonicalGrid,_std::default_delete<TasGrid::BaseCanonicalGrid>_>
           ._M_t.
           super__Tuple_impl<0UL,_TasGrid::BaseCanonicalGrid_*,_std::default_delete<TasGrid::BaseCanonicalGrid>_>
           .super__Head_base<0UL,_TasGrid::BaseCanonicalGrid_*,_false>._M_head_impl;
  if (pBVar1 != (BaseCanonicalGrid *)0x0) {
    (*pBVar1->_vptr_BaseCanonicalGrid[8])(pBVar1,ofs,1);
  }
  if ((this->domain_transform_a).super__Vector_base<double,_std::allocator<double>_>._M_impl.
      super__Vector_impl_data._M_finish ==
      (this->domain_transform_a).super__Vector_base<double,_std::allocator<double>_>._M_impl.
      super__Vector_impl_data._M_start) {
    IO::writeNumbers<true,(TasGrid::IO::IOPad)0,char>(ofs,'n');
  }
  else {
    IO::writeNumbers<true,(TasGrid::IO::IOPad)0,char>(ofs,'y');
    IO::writeVector<true,(TasGrid::IO::IOPad)0,double>(&this->domain_transform_a,ofs);
    IO::writeVector<true,(TasGrid::IO::IOPad)0,double>(&this->domain_transform_b,ofs);
  }
  if ((this->conformal_asin_power).super__Vector_base<int,_std::allocator<int>_>._M_impl.
      super__Vector_impl_data._M_finish ==
      (this->conformal_asin_power).super__Vector_base<int,_std::allocator<int>_>._M_impl.
      super__Vector_impl_data._M_start) {
    IO::writeNumbers<true,(TasGrid::IO::IOPad)0,char>(ofs,'n');
  }
  else {
    IO::writeNumbers<true,(TasGrid::IO::IOPad)0,char>(ofs,'a');
    IO::writeVector<true,(TasGrid::IO::IOPad)0,int>(&this->conformal_asin_power,ofs);
  }
  if ((this->llimits).super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
      _M_start ==
      (this->llimits).super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
      _M_finish) {
    IO::writeNumbers<true,(TasGrid::IO::IOPad)0,char>(ofs,'n');
  }
  else {
    IO::writeNumbers<true,(TasGrid::IO::IOPad)0,char>(ofs,'y');
    IO::writeVector<true,(TasGrid::IO::IOPad)0,int>(&this->llimits,ofs);
  }
  if (this->using_dynamic_construction == true) {
    IO::writeNumbers<true,(TasGrid::IO::IOPad)0,char>(ofs,'c');
    pBVar1 = (this->base)._M_t.
             super___uniq_ptr_impl<TasGrid::BaseCanonicalGrid,_std::default_delete<TasGrid::BaseCanonicalGrid>_>
             ._M_t.
             super__Tuple_impl<0UL,_TasGrid::BaseCanonicalGrid_*,_std::default_delete<TasGrid::BaseCanonicalGrid>_>
             .super__Head_base<0UL,_TasGrid::BaseCanonicalGrid_*,_false>._M_head_impl;
    (*pBVar1->_vptr_BaseCanonicalGrid[0x1b])(pBVar1,ofs,1);
  }
  else {
    IO::writeNumbers<true,(TasGrid::IO::IOPad)0,char>(ofs,'s');
  }
  IO::writeNumbers<true,(TasGrid::IO::IOPad)0,char>(ofs,'e');
  return;
}

Assistant:

void TasmanianSparseGrid::writeBinary(std::ostream &ofs) const{
    const char *TSG = "TSG5"; // last char indicates version (update only if necessary, no need to sync with getVersionMajor())
    ofs.write(TSG, 4 * sizeof(char)); // mark Tasmanian files
    // use Integers to indicate grid types, empty 'e', global 'g', sequence 's', pwpoly 'p', wavelet 'w', Fourier 'f'
    if (isGlobal()){
        IO::writeNumbers<mode_binary, IO::pad_none>(ofs, 'g');
    }else if (isSequence()){
        IO::writeNumbers<mode_binary, IO::pad_none>(ofs, 's');
    }else if (isLocalPolynomial()){
        IO::writeNumbers<mode_binary, IO::pad_none>(ofs, 'p');
    }else if (isWavelet()){
        IO::writeNumbers<mode_binary, IO::pad_none>(ofs, 'w');
    }else if (isFourier()){
        IO::writeNumbers<mode_binary, IO::pad_none>(ofs, 'f');
    }else{
        IO::writeNumbers<mode_binary, IO::pad_none>(ofs, 'e');
    }
    if (!empty()) base->write(ofs, mode_binary);
    // domain transform: custom 'y', canonical: 'n'
    if (domain_transform_a.size() != 0){
        IO::writeNumbers<mode_binary, IO::pad_none>(ofs, 'y');
        IO::writeVector<mode_binary, IO::pad_none>(domain_transform_a, ofs);
        IO::writeVector<mode_binary, IO::pad_none>(domain_transform_b, ofs);
    }else{
        IO::writeNumbers<mode_binary, IO::pad_none>(ofs, 'n');
    }
    // conformal transforms: none 'n', asin 'a'
    if (conformal_asin_power.size() != 0){
        IO::writeNumbers<mode_binary, IO::pad_none>(ofs, 'a');
        IO::writeVector<mode_binary, IO::pad_none>(conformal_asin_power, ofs);
    }else{
        IO::writeNumbers<mode_binary, IO::pad_none>(ofs, 'n');
    }
    if (!llimits.empty()){
        IO::writeNumbers<mode_binary, IO::pad_none>(ofs, 'y');
        IO::writeVector<mode_binary, IO::pad_none>(llimits, ofs);
    }else{
        IO::writeNumbers<mode_binary, IO::pad_none>(ofs, 'n');
    }
    if (using_dynamic_construction){
        IO::writeNumbers<mode_binary, IO::pad_none>(ofs, 'c');
        base->writeConstructionData(ofs, mode_binary);
    }else{
        IO::writeNumbers<mode_binary, IO::pad_none>(ofs, 's');
    }
    IO::writeNumbers<mode_binary, IO::pad_none>(ofs, 'e'); // E stands for END
}